

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void luaV_gettable(lua_State *L,TValue *t,TValue *key,StkId val)

{
  GCObject *t_00;
  Table *events;
  int iVar1;
  TValue *pTVar2;
  TValue *f;
  int iVar3;
  TValue *o2;
  int iVar4;
  
  iVar3 = t->tt;
  iVar4 = 100;
  do {
    if (iVar3 == 5) {
      t_00 = (t->value).gc;
      pTVar2 = luaH_get(&t_00->h,key);
      if (((pTVar2->tt != 0) || (events = (t_00->h).metatable, events == (Table *)0x0)) ||
         ((events->flags & 1) != 0)) {
LAB_00107231:
        val->value = pTVar2->value;
        val->tt = pTVar2->tt;
        return;
      }
      f = luaT_gettm(events,TM_INDEX,L->l_G->tmname[0]);
      if (f == (TValue *)0x0) goto LAB_00107231;
      iVar1 = f->tt;
    }
    else {
      f = luaT_gettmbyobj(L,t,TM_INDEX);
      iVar1 = f->tt;
      if (f->tt == 0) {
        luaG_runerror(L,"attempt to %s a %s value","index",luaT_typenames[iVar3]);
      }
    }
    iVar3 = iVar1;
    if (iVar3 == 6) {
      callTMres(L,val,f,t,key);
      return;
    }
    iVar4 = iVar4 + -1;
    t = f;
    if (iVar4 == 0) {
      luaG_runerror(L,"loop in gettable");
    }
  } while( true );
}

Assistant:

static void luaV_gettable(lua_State*L,const TValue*t,TValue*key,StkId val){
int loop;
for(loop=0;loop<100;loop++){
const TValue*tm;
if(ttistable(t)){
Table*h=hvalue(t);
const TValue*res=luaH_get(h,key);
if(!ttisnil(res)||
(tm=fasttm(L,h->metatable,TM_INDEX))==NULL){
setobj(L,val,res);
return;
}
}
else if(ttisnil(tm=luaT_gettmbyobj(L,t,TM_INDEX)))
luaG_typeerror(L,t,"index");
if(ttisfunction(tm)){
callTMres(L,val,tm,t,key);
return;
}
t=tm;
}
luaG_runerror(L,"loop in gettable");
}